

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

void wipe_mon_list(chunk *c,player *p)

{
  loc_conflict grid;
  _Bool _Var1;
  monster_conflict *__s;
  chunk *local_50;
  object *local_40;
  object *local_38;
  object *obj;
  object *held_obj;
  monster *mon;
  wchar_t i;
  wchar_t m_idx;
  player *p_local;
  chunk *c_local;
  
  mon._4_4_ = cave_monster_max((chunk_conflict *)c);
  while (mon._4_4_ = mon._4_4_ + L'\xffffffff', L'\0' < mon._4_4_) {
    __s = cave_monster((chunk_conflict *)c,mon._4_4_);
    if (__s == (monster_conflict *)0x0) {
      local_40 = (object *)0x0;
    }
    else {
      local_40 = __s->held_obj;
    }
    if (__s->race != (monster_race *)0x0) {
      if (local_40 != (object *)0x0) {
        for (local_38 = local_40; local_38 != (object *)0x0; local_38 = local_38->next) {
          if ((local_38->artifact != (artifact *)0x0) &&
             (_Var1 = obj_is_known_artifact(local_38), !_Var1)) {
            mark_artifact_created(local_38->artifact,false);
          }
          if (local_38->oidx != 0) {
            c->objects[local_38->oidx] = (object *)0x0;
          }
        }
        if ((p == (player *)0x0) || (c != (chunk *)cave)) {
          local_50 = (chunk *)0x0;
        }
        else {
          local_50 = (chunk *)p->cave;
        }
        object_pile_free(c,local_50,local_40);
      }
      if (__s->original_race == (monster_race *)0x0) {
        __s->race->cur_num = __s->race->cur_num + L'\xffffffff';
      }
      else {
        __s->original_race->cur_num = __s->original_race->cur_num + L'\xffffffff';
      }
      grid.x = (__s->grid).x;
      grid.y = (__s->grid).y;
      square_set_mon(c,grid,L'\0');
      memset(__s,0,0x1a0);
    }
  }
  for (mon._0_4_ = 1; (int)mon < (int)(uint)z_info->level_monster_max; mon._0_4_ = (int)mon + 1) {
    if (c->monster_groups[(int)mon] != (monster_group_conflict *)0x0) {
      monster_group_free(c,c->monster_groups[(int)mon]);
    }
  }
  c->mon_max = 1;
  c->mon_cnt = 0;
  c->num_repro = L'\0';
  target_set_monster((monster *)0x0);
  health_track(p->upkeep,(monster *)0x0);
  return;
}

Assistant:

void wipe_mon_list(struct chunk *c, struct player *p)
{
	int m_idx, i;

	/* Delete all the monsters */
	for (m_idx = cave_monster_max(c) - 1; m_idx >= 1; m_idx--) {
		struct monster *mon = cave_monster(c, m_idx);
		struct object *held_obj = mon ? mon->held_obj : NULL;

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Delete all the objects */
		if (held_obj) {
			/* Go through all held objects and check for artifacts */
			struct object *obj = held_obj;
			while (obj) {
				if (obj->artifact && !obj_is_known_artifact(obj)) {
					mark_artifact_created(obj->artifact,
						false);
				}
				/*
				 * Also, remove from the cave's object list.
				 * That way, the scan for orphaned objects
				 * in cave_free() doesn't attempt to
				 * access freed memory or free memory
				 * twice.
				 */
				if (obj->oidx) {
					c->objects[obj->oidx] = NULL;
				}
				obj = obj->next;
			}
			object_pile_free(c, (p && c == cave) ? p->cave : NULL,
				held_obj);
		}

		/* Reduce the racial counter */
		if (mon->original_race) mon->original_race->cur_num--;
		else mon->race->cur_num--;

		/* Monster is gone from square */
		square_set_mon(c, mon->grid, 0);

		/* Wipe the Monster */
		memset(mon, 0, sizeof(struct monster));
	}

	/* Delete all the monster groups */
	for (i = 1; i < z_info->level_monster_max; i++) {
		if (c->monster_groups[i]) {
			monster_group_free(c, c->monster_groups[i]);
		}
	}

	/* Reset "cave->mon_max" */
	c->mon_max = 1;

	/* Reset "mon_cnt" */
	c->mon_cnt = 0;

	/* Reset "reproducer" count */
	c->num_repro = 0;

	/* Hack -- no more target */
	target_set_monster(0);

	/* Hack -- no more tracking */
	health_track(p->upkeep, 0);
}